

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  TestCaseInfo *_name;
  size_type sVar2;
  pointer _string;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  Colour local_59;
  undefined1 auStack_58 [7];
  Colour colourGuard;
  SourceLineInfo lineInfo;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_30;
  iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_20;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  it;
  Colour colourGuard_1;
  ConsoleReporter *this_local;
  
  bVar1 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::empty
                    (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]yacppl/test/3rdparty/Catch2/catch.hpp"
                  ,0x40f2,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
  }
  _name = Option<Catch::TestCaseInfo>::operator->
                    (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                      currentTestCaseInfo.super_Option<Catch::TestCaseInfo>);
  printOpenHeader(this,&_name->name);
  sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
  if (1 < sVar2) {
    Colour::Colour((Colour *)((long)&it._M_current + 7),Headers);
    itEnd = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                      (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
    local_20 = __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+(&itEnd,1);
    local_30._M_current =
         (SectionInfo *)
         clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                   (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      _string = __gnu_cxx::
                __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                ::operator->(&local_20);
      printHeaderString(this,&_string->name,2);
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(&local_20);
    }
    Colour::~Colour((Colour *)((long)&it._M_current + 7));
  }
  pvVar3 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
                     (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
  _auStack_58 = (pvVar3->lineInfo).file;
  poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  pcVar4 = getLineOfChars<(char)45>();
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::operator<<(poVar5,'\n');
  Colour::Colour(&local_59,FileName);
  poVar5 = Catch::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             (SourceLineInfo *)auStack_58);
  std::operator<<(poVar5,'\n');
  poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  pcVar4 = getLineOfChars<(char)46>();
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5,'\n');
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Colour::~Colour(&local_59);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}